

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

_Bool get_move_find_safety(monster_conflict *mon)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc grid2;
  loc_conflict grid_00;
  wchar_t local_50;
  wchar_t wStack_4c;
  loc grid;
  loc best;
  wchar_t *x_offsets;
  wchar_t *y_offsets;
  wchar_t gdis;
  wchar_t dis;
  wchar_t d;
  wchar_t dx;
  wchar_t dy;
  wchar_t i;
  monster_conflict *mon_local;
  
  y_offsets._0_4_ = L'\0';
  gdis = L'\x01';
  while( true ) {
    if (L'\t' < gdis) {
      return false;
    }
    grid = loc(0,0);
    pwVar1 = dist_offsets_y[gdis];
    pwVar2 = dist_offsets_x[gdis];
    dx = L'\0';
    d = *pwVar1;
    dis = *pwVar2;
    while (dis != L'\0' || d != L'\0') {
      grid2 = loc(dis,d);
      grid_00 = (loc_conflict)loc_sum(mon->grid,grid2);
      _Var3 = square_in_bounds_fully((chunk *)cave,grid_00);
      if ((_Var3) && (_Var3 = square_ispassable((chunk *)cave,grid_00), _Var3)) {
        wStack_4c = grid_00.y;
        local_50 = grid_00.x;
        if (((int)(uint)(cave->noise).grids[wStack_4c][local_50] <=
             (uint)(cave->noise).grids[(mon->grid).y][(mon->grid).x] + gdis * 2) &&
           (((_Var3 = monster_hates_grid(mon,(loc)grid_00), !_Var3 &&
             (_Var3 = square_isview((chunk *)cave,grid_00), !_Var3)) &&
            (wVar4 = distance((loc)grid_00,player->grid), (wchar_t)y_offsets < wVar4)))) {
          grid = (loc)grid_00;
          y_offsets._0_4_ = wVar4;
        }
      }
      dx = dx + L'\x01';
      d = pwVar1[dx];
      dis = pwVar2[dx];
    }
    if (L'\0' < (wchar_t)y_offsets) break;
    gdis = gdis + L'\x01';
  }
  (mon->target).grid = grid;
  return true;
}

Assistant:

static bool get_move_find_safety(struct monster *mon)
{
	int i, dy, dx, d, dis, gdis = 0;

	const int *y_offsets;
	const int *x_offsets;

	/* Start with adjacent locations, spread further */
	for (d = 1; d < 10; d++) {
		struct loc best = loc(0, 0);

		/* Get the lists of points with a distance d from (fx, fy) */
		y_offsets = dist_offsets_y[d];
		x_offsets = dist_offsets_x[d];

		/* Check the locations */
		for (i = 0, dx = x_offsets[0], dy = y_offsets[0];
		     dx != 0 || dy != 0;
		     i++, dx = x_offsets[i], dy = y_offsets[i]) {
			struct loc grid = loc_sum(mon->grid, loc(dx, dy));

			/* Skip illegal locations */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip locations in a wall */
			if (!square_ispassable(cave, grid)) continue;

			/* Ignore too-distant grids */
			if (cave->noise.grids[grid.y][grid.x] >
				cave->noise.grids[mon->grid.y][mon->grid.x] + 2 * d)
				continue;

			/* Ignore damaging terrain if they can't handle it */
			if (monster_hates_grid(mon, grid)) continue;

			/* Check for absence of shot (more or less) */
			if (!square_isview(cave, grid)) {
				/* Calculate distance from player */
				dis = distance(grid, player->grid);

				/* Remember if further than previous */
				if (dis > gdis) {
					best = grid;
					gdis = dis;
				}
			}
		}

		/* Check for success */
		if (gdis > 0) {
			/* Good location */
			mon->target.grid = best;
			return (true);
		}
	}

	/* No safe place */
	return (false);
}